

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

boundaries __thiscall fmt::v6::internal::fp::assign_float_with_boundaries<double>(fp *this,double d)

{
  uint uVar1;
  undefined8 extraout_RDX;
  ulong uVar2;
  fp fVar3;
  boundaries bVar4;
  
  assign<double,_0>(this,d);
  uVar1 = this->e;
  fVar3.f = (ulong)uVar1;
  uVar2 = 0x10000000L << (0x4eU - (char)uVar1 & 0x3f);
  if (-0xb3 < (int)uVar1) {
    uVar2 = 0x10000000;
  }
  fVar3._8_8_ = extraout_RDX;
  fVar3 = normalize<0>((internal *)(this->f + uVar2),fVar3);
  bVar4.upper = fVar3.f;
  bVar4.lower = this->f - (uVar2 >> (-0xb2 < this->e && this->f == 0x10000000000000)) <<
                ((char)this->e - (char)fVar3.e & 0x3fU);
  return bVar4;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }